

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLookupResultValid
               (Texture1DArrayView *texture,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  FilterMode FVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int coordY;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Vec2 local_38;
  
  if (texture->m_numLevels < 1) {
    iVar14 = -1;
  }
  else {
    iVar14 = (texture->m_levels->m_size).m_data[1] + -1;
  }
  fVar18 = coord->m_data[1];
  fVar16 = TexVerifierUtil::computeFloatingPointError(fVar18,(prec->coordBits).m_data[1]);
  fVar17 = floorf((fVar18 - fVar16) + 0.5);
  iVar11 = (int)fVar17;
  fVar18 = ceilf(fVar18 + fVar16 + 0.5);
  iVar4 = (int)fVar18 + -1;
  coordY = iVar14;
  if (iVar11 < iVar14) {
    coordY = iVar11;
  }
  if (iVar11 < 0) {
    coordY = 0;
  }
  if (iVar4 < iVar14) {
    iVar14 = iVar4;
  }
  if (iVar4 < 0) {
    iVar14 = 0;
  }
  bVar10 = coordY <= iVar14;
  if (coordY <= iVar14) {
    fVar18 = coord->m_data[0];
    fVar16 = lodBounds->m_data[0];
    fVar17 = lodBounds->m_data[1];
    fVar1 = sampler->lodThreshold;
    fVar19 = ceilf(fVar16 + 0.5);
    iVar4 = (int)fVar19 + -1;
    fVar19 = floorf(fVar17 + 0.5);
    iVar11 = (int)fVar19;
    fVar19 = floorf(fVar16);
    iVar5 = (int)fVar19;
    fVar19 = floorf(fVar17);
    iVar6 = (int)fVar19;
    do {
      if ((fVar16 <= fVar1) &&
         (bVar2 = isLevelSampleResultValid
                            (texture->m_levels,sampler,sampler->magFilter,prec,fVar18,coordY,result)
         , bVar2)) {
        return bVar10;
      }
      if (fVar1 < fVar17) {
        FVar9 = sampler->minFilter;
        iVar12 = texture->m_numLevels + -1;
        if (iVar12 < 1 || (FVar9 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
          if ((FVar9 == LINEAR_MIPMAP_NEAREST) || (FVar9 == NEAREST_MIPMAP_NEAREST)) {
            iVar13 = iVar12;
            if (iVar4 < iVar12) {
              iVar13 = iVar4;
            }
            iVar8 = 0;
            if (iVar4 < 0) {
              iVar13 = iVar8;
            }
            if (iVar11 < iVar12) {
              iVar12 = iVar11;
            }
            if (iVar11 < 0) {
              iVar12 = 0;
            }
            bVar2 = iVar12 < iVar13;
            if (iVar13 <= iVar12) {
              do {
                uVar7 = sampler->minFilter - LINEAR;
                FVar9 = NEAREST;
                if (uVar7 < 5) {
                  FVar9 = *(FilterMode *)(&DAT_00b8ec38 + (ulong)uVar7 * 4);
                }
                bVar3 = isLevelSampleResultValid
                                  (texture->m_levels + iVar13,sampler,FVar9,prec,fVar18,coordY,
                                   result);
                if (bVar3) {
                  iVar8 = 1;
                  goto LAB_00a6ba03;
                }
                iVar13 = iVar13 + 1;
                bVar2 = iVar12 < iVar13;
              } while (iVar13 <= iVar12);
              iVar8 = 0;
            }
LAB_00a6ba03:
            if (bVar2) goto LAB_00a6b9b9;
          }
          else {
            bVar2 = isLevelSampleResultValid
                              (texture->m_levels,sampler,FVar9,prec,fVar18,coordY,result);
            iVar8 = 1;
            if (!bVar2) {
LAB_00a6b9b9:
              iVar8 = 0;
            }
          }
        }
        else {
          iVar13 = texture->m_numLevels + -2;
          iVar12 = iVar13;
          if (iVar5 < iVar13) {
            iVar12 = iVar5;
          }
          if (iVar5 < 0) {
            iVar12 = 0;
          }
          if (iVar6 < iVar13) {
            iVar13 = iVar6;
          }
          if (iVar6 < 0) {
            iVar13 = 0;
          }
          do {
            iVar15 = iVar12;
            if (iVar13 < iVar15) {
              iVar8 = 0;
              goto LAB_00a6b9af;
            }
            uVar7 = sampler->minFilter - LINEAR;
            FVar9 = NEAREST;
            if (uVar7 < 5) {
              FVar9 = *(FilterMode *)(&DAT_00b8ec38 + (ulong)uVar7 * 4);
            }
            fVar19 = fVar16 - (float)iVar15;
            local_38.m_data[0] = 1.0;
            if (fVar19 <= 1.0) {
              local_38.m_data[0] = fVar19;
            }
            local_38.m_data[0] = (float)(~-(uint)(fVar19 < 0.0) & (uint)local_38.m_data[0]);
            fVar19 = fVar17 - (float)iVar15;
            local_38.m_data[1] = 1.0;
            if (fVar19 <= 1.0) {
              local_38.m_data[1] = fVar19;
            }
            local_38.m_data[1] = (float)(~-(uint)(fVar19 < 0.0) & (uint)local_38.m_data[1]);
            bVar2 = isMipmapLinearSampleResultValid
                              (texture->m_levels + iVar15,texture->m_levels + (iVar15 + 1),sampler,
                               FVar9,prec,fVar18,coordY,&local_38,result);
            iVar12 = iVar15 + 1;
          } while (!bVar2);
          iVar8 = 1;
LAB_00a6b9af:
          if (iVar13 < iVar15) goto LAB_00a6b9b9;
        }
        if (iVar8 != 0) {
          return bVar10;
        }
      }
      coordY = coordY + 1;
      bVar10 = coordY <= iVar14;
    } while (coordY <= iVar14);
  }
  return bVar10;
}

Assistant:

bool isLookupResultValid (const Texture1DArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec2& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2		layerRange		= computeLayerRange(texture.getNumLayers(), prec.coordBits.y(), coord.y());
	const float		coordX			= coord.x();
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	for (int layer = layerRange.x(); layer <= layerRange.y(); layer++)
	{
		if (canBeMagnified)
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coordX, layer, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
					const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

					if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int level = minLevel; level <= maxLevel; level++)
				{
					if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coordX, layer, result))
						return true;
				}
			}
			else
			{
				if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coordX, layer, result))
					return true;
			}
		}
	}

	return false;
}